

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  pointer ppcVar1;
  cmLocalUnixMakefileGenerator3 *this_00;
  ostream *poVar2;
  uint uVar3;
  __node_base *p_Var4;
  string tname;
  string local_50;
  
  std::operator<<((ostream *)cmakefileStream,"# Dependency information for all targets:\n");
  std::operator<<((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n");
  uVar3 = 0;
  while( true ) {
    ppcVar1 = (lGenerators->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(lGenerators->
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar3) break;
    this_00 = (cmLocalUnixMakefileGenerator3 *)ppcVar1[uVar3];
    p_Var4 = &(((this_00->super_cmLocalGenerator).Makefile)->Targets)._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      if (*(uint *)&p_Var4[0x61]._M_nxt < 6) {
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_50,this_00,(cmTarget *)(p_Var4 + 5));
        std::__cxx11::string::append((char *)&local_50);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_50);
        poVar2 = std::operator<<((ostream *)cmakefileStream,"  \"");
        poVar2 = std::operator<<(poVar2,(string *)&local_50);
        std::operator<<(poVar2,"\"\n");
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    uVar3 = uVar3 + 1;
  }
  std::operator<<((ostream *)cmakefileStream,"  )\n");
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::WriteMainCMakefileLanguageRules(cmGeneratedFileStream& cmakefileStream,
                                  std::vector<cmLocalGenerator *> &lGenerators
                                  )
{
  cmLocalUnixMakefileGenerator3 *lg;

  // now list all the target info files
  cmakefileStream
    << "# Dependency information for all targets:\n";
  cmakefileStream
    << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (unsigned int i = 0; i < lGenerators.size(); ++i)
    {
    lg = static_cast<cmLocalUnixMakefileGenerator3 *>(lGenerators[i]);
    // for all of out targets
    for (cmTargets::iterator l = lg->GetMakefile()->GetTargets().begin();
         l != lg->GetMakefile()->GetTargets().end(); l++)
      {
      if((l->second.GetType() == cmTarget::EXECUTABLE) ||
         (l->second.GetType() == cmTarget::STATIC_LIBRARY) ||
         (l->second.GetType() == cmTarget::SHARED_LIBRARY) ||
         (l->second.GetType() == cmTarget::MODULE_LIBRARY) ||
         (l->second.GetType() == cmTarget::OBJECT_LIBRARY) ||
         (l->second.GetType() == cmTarget::UTILITY))
        {
        std::string tname = lg->GetRelativeTargetDirectory(l->second);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
        }
      }
    }
  cmakefileStream << "  )\n";
}